

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

void __thiscall NavierStokesBase::computeGradP(NavierStokesBase *this,Real time)

{
  initializer_list<amrex::Geometry> iVar1;
  initializer_list<amrex::BoxArray> iVar2;
  initializer_list<amrex::DistributionMapping> iVar3;
  initializer_list<const_amrex::FabFactory<amrex::FArrayBox>_*> iVar4;
  FabArrayBase *this_00;
  long in_RDI;
  MultiFab *Gp;
  MultiFab *Press;
  MLNodeLaplacian linop;
  LPInfo info;
  undefined4 in_stack_fffffffffffff688;
  undefined4 in_stack_fffffffffffff68c;
  MLNodeLaplacian *in_stack_fffffffffffff690;
  iterator in_stack_fffffffffffff698;
  MLNodeLaplacian *in_stack_fffffffffffff6a0;
  int in_stack_fffffffffffff6ac;
  AmrLevel *in_stack_fffffffffffff6b0;
  Real in_stack_fffffffffffff6d0;
  Vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
  *in_stack_fffffffffffff6d8;
  undefined4 in_stack_fffffffffffff6e0;
  undefined4 in_stack_fffffffffffff6e4;
  Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
  *in_stack_fffffffffffff6e8;
  undefined8 **ppuVar5;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *in_stack_fffffffffffff6f0;
  undefined8 **ppuVar6;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *in_stack_fffffffffffff6f8;
  MLNodeLaplacian *in_stack_fffffffffffff700;
  undefined1 **local_8f0;
  FabFactory<amrex::FArrayBox> *local_890;
  FabFactory<amrex::FArrayBox> **local_888;
  undefined8 local_880;
  undefined1 *local_858 [2];
  undefined8 *local_848;
  undefined8 local_840;
  undefined8 *local_818;
  undefined1 *local_810 [13];
  undefined8 *local_7a8;
  undefined8 local_7a0;
  undefined1 local_768 [36];
  int in_stack_fffffffffffff8bc;
  int in_stack_fffffffffffff8c0;
  int in_stack_fffffffffffff8c4;
  Real in_stack_fffffffffffff8c8;
  int in_stack_fffffffffffff8d4;
  MultiFab *in_stack_fffffffffffff8d8;
  AmrLevel *in_stack_fffffffffffff8e0;
  int in_stack_fffffffffffff8f0;
  MultiFab *in_stack_fffffffffffff9a8;
  MultiFab *in_stack_fffffffffffff9b0;
  int in_stack_fffffffffffff9bc;
  MLNodeLaplacian *in_stack_fffffffffffff9c0;
  LPInfo local_30;
  
  amrex::LPInfo::LPInfo(&local_30);
  amrex::LPInfo::setMaxCoarseningLevel(&local_30,0);
  memcpy(local_768,(void *)(in_RDI + 0x10),200);
  std::allocator<amrex::Geometry>::allocator((allocator<amrex::Geometry> *)0x7c10b3);
  iVar1._M_len = (size_type)in_stack_fffffffffffff6a0;
  iVar1._M_array = in_stack_fffffffffffff698;
  amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
            ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)in_stack_fffffffffffff690,
             iVar1,(allocator_type *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
  local_818 = local_810;
  amrex::BoxArray::BoxArray
            ((BoxArray *)in_stack_fffffffffffff690,
             (BoxArray *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
  local_7a8 = local_810;
  local_7a0 = 1;
  std::allocator<amrex::BoxArray>::allocator((allocator<amrex::BoxArray> *)0x7c1131);
  iVar2._M_len = (size_type)in_stack_fffffffffffff6a0;
  iVar2._M_array = (iterator)in_stack_fffffffffffff698;
  amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
            ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)in_stack_fffffffffffff690,
             iVar2,(allocator_type *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
  amrex::DistributionMapping::DistributionMapping
            ((DistributionMapping *)in_stack_fffffffffffff690,
             (DistributionMapping *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
  local_840 = 1;
  local_848 = local_858;
  std::allocator<amrex::DistributionMapping>::allocator
            ((allocator<amrex::DistributionMapping> *)0x7c11ad);
  iVar3._M_len = (size_type)in_stack_fffffffffffff6a0;
  iVar3._M_array = (iterator)in_stack_fffffffffffff698;
  amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::vector
            ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
             in_stack_fffffffffffff690,iVar3,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
  local_890 = amrex::AmrLevel::Factory((AmrLevel *)in_stack_fffffffffffff690);
  local_888 = &local_890;
  local_880 = 1;
  std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>::allocator
            ((allocator<const_amrex::FabFactory<amrex::FArrayBox>_*> *)0x7c121a);
  iVar4._M_len = (size_type)in_stack_fffffffffffff6a0;
  iVar4._M_array = (iterator)in_stack_fffffffffffff698;
  amrex::
  Vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
  ::vector((Vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
            *)in_stack_fffffffffffff690,iVar4,
           (allocator_type *)CONCAT44(in_stack_fffffffffffff68c,in_stack_fffffffffffff688));
  amrex::MLNodeLaplacian::MLNodeLaplacian
            (in_stack_fffffffffffff700,in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0,
             in_stack_fffffffffffff6e8,
             (LPInfo *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0),
             in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
  amrex::
  Vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
  ::~Vector((Vector<const_amrex::FabFactory<amrex::FArrayBox>_*,_std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>_>
             *)0x7c1288);
  std::allocator<const_amrex::FabFactory<amrex::FArrayBox>_*>::~allocator
            ((allocator<const_amrex::FabFactory<amrex::FArrayBox>_*> *)0x7c1295);
  amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~Vector
            ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
             0x7c12a2);
  std::allocator<amrex::DistributionMapping>::~allocator
            ((allocator<amrex::DistributionMapping> *)0x7c12af);
  local_8f0 = (undefined1 **)&local_848;
  do {
    local_8f0 = local_8f0 + -2;
    amrex::DistributionMapping::~DistributionMapping((DistributionMapping *)0x7c12e1);
  } while (local_8f0 != local_858);
  amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~Vector
            ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)0x7c1308);
  std::allocator<amrex::BoxArray>::~allocator((allocator<amrex::BoxArray> *)0x7c1315);
  ppuVar6 = (undefined8 **)local_810;
  ppuVar5 = &local_7a8;
  do {
    ppuVar5 = ppuVar5 + -0xd;
    amrex::BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffff690);
  } while (ppuVar5 != ppuVar6);
  amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::~Vector
            ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)0x7c135f);
  std::allocator<amrex::Geometry>::~allocator((allocator<amrex::Geometry> *)0x7c136c);
  amrex::MLNodeLaplacian::buildIntegral(in_stack_fffffffffffff6a0);
  amrex::AmrLevel::get_data
            (in_stack_fffffffffffff6b0,in_stack_fffffffffffff6ac,(Real)in_stack_fffffffffffff6a0);
  this_00 = (FabArrayBase *)
            amrex::AmrLevel::get_data
                      (in_stack_fffffffffffff6b0,in_stack_fffffffffffff6ac,
                       (Real)in_stack_fffffffffffff6a0);
  amrex::MLNodeLaplacian::compGrad
            (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b0,
             in_stack_fffffffffffff9a8);
  amrex::FabArrayBase::nGrow(this_00,0);
  amrex::AmrLevel::FillPatch
            (in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d4,
             in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0,
             in_stack_fffffffffffff8bc,in_stack_fffffffffffff8f0);
  amrex::MLNodeLaplacian::~MLNodeLaplacian(in_stack_fffffffffffff690);
  return;
}

Assistant:

void
NavierStokesBase::computeGradP(Real time)
{
    LPInfo info;
    info.setMaxCoarseningLevel(0);
    MLNodeLaplacian linop({geom}, {grids}, {dmap}, info, {&Factory()});
#ifdef AMREX_USE_EB
    linop.buildIntegral();
#endif

    // No call to set BCs because we're only calling compGrad(), which
    // doesn't use them. P already exists on surroundingNodes(Gp.validbox()),
    // and compGrad() does not fill ghost cells

    MultiFab& Press = get_data(Press_Type, time);
    MultiFab& Gp    = get_data(Gradp_Type, time);

    linop.compGrad(0, Gp, Press);

    // Now fill ghost cells
    FillPatch(*this,Gp,Gp.nGrow(),time,Gradp_Type,0,AMREX_SPACEDIM);
}